

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<unsigned_char,signed_char>::
Flush<duckdb::BitpackingCompressionState<unsigned_char,true,signed_char>::BitpackingWriter>
          (BitpackingState<unsigned_char,signed_char> *this)

{
  int iVar1;
  BitpackingState<unsigned_char,signed_char> BVar2;
  BitpackingState<unsigned_char,signed_char> BVar3;
  unsigned_long uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  uchar *values;
  byte bVar8;
  ulong uVar9;
  
  bVar7 = true;
  if (*(idx_t *)(this + 0x1810) == 0) {
    return true;
  }
  if (this[0x1830] == (BitpackingState<unsigned_char,signed_char>)0x0) {
    BVar3 = this[0x1828];
    BVar2 = this[0x1829];
    if (BVar2 != BVar3) goto LAB_01725f33;
  }
  BVar2 = this[0x1829];
  if ((byte)((char)this[0x1833] - 1U) < 2) {
    BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::WriteConstant
              ((uchar)BVar2,*(idx_t *)(this + 0x1810),*(void **)(this + 0x1820),(bool)this[0x1830]);
    *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 5;
    return true;
  }
  BVar3 = this[0x1828];
LAB_01725f33:
  BVar3 = (BitpackingState<unsigned_char,signed_char>)
          TrySubtractOperator::Operation<unsigned_char,unsigned_char,unsigned_char>
                    ((uint8_t)BVar2,(uint8_t)BVar3,(uint8_t *)(this + 0x182a));
  this[0x1832] = BVar3;
  BitpackingState<unsigned_char,_signed_char>::CalculateDeltaStats
            ((BitpackingState<unsigned_char,_signed_char> *)this);
  if (this[0x1831] == (BitpackingState<unsigned_char,signed_char>)0x1) {
    BVar3 = this[0x182b];
    if (((byte)this[0x1833] & 0xfe) != 4 && this[0x182c] == BVar3) {
      BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::
      WriteConstantDelta((char)this[0x182c],**(uchar **)(this + 0x808),*(idx_t *)(this + 0x1810),
                         *(uchar **)(this + 0x808),(bool *)(this + 0x1010),*(void **)(this + 0x1820)
                        );
      *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 6;
      return true;
    }
    BVar2 = this[0x182d];
    iVar1 = 0x1f;
    if (BVar2 != (BitpackingState<unsigned_char,signed_char>)0x0) {
      for (; (byte)BVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    bVar8 = 8 - ((byte)iVar1 ^ 7);
    if (BVar2 == (BitpackingState<unsigned_char,signed_char>)0x0) {
      bVar8 = 0;
    }
    BVar2 = this[0x182a];
    iVar1 = 0x1f;
    if (BVar2 != (BitpackingState<unsigned_char,signed_char>)0x0) {
      for (; (byte)BVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    if ((this[0x1833] != (BitpackingState<unsigned_char,signed_char>)0x5 &&
        BVar2 != (BitpackingState<unsigned_char,signed_char>)0x0) &&
        bVar8 < (byte)(8 - ((byte)iVar1 ^ 7))) {
      if (*(long *)(this + 0x1810) == 0) {
        uVar9 = 0;
      }
      else {
        uVar6 = 0;
        do {
          this[uVar6 + 0x810] =
               (BitpackingState<unsigned_char,signed_char>)((char)this[uVar6 + 0x810] - (char)BVar3)
          ;
          uVar6 = uVar6 + 1;
          uVar9 = *(ulong *)(this + 0x1810);
        } while (uVar6 < uVar9);
        BVar3 = this[0x182b];
      }
      BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::WriteDeltaFor
                ((uchar *)(this + 0x810),(bool *)(this + 0x1010),bVar8,(uchar)BVar3,
                 (char)this[0x182e],*(uchar **)(this + 0x808),uVar9,*(void **)(this + 0x1820));
      uVar9 = *(ulong *)(this + 0x1810);
      lVar5 = *(long *)(this + 0x1818) + 10;
      *(long *)(this + 0x1818) = lVar5;
      if ((uVar9 & 0x1f) != 0) {
        uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar9 & 0x1f);
        uVar9 = (uVar9 - uVar4) + 0x20;
        lVar5 = *(long *)(this + 0x1818);
      }
      *(ulong *)(this + 0x1818) = (bVar8 * uVar9 >> 3) + lVar5;
      return true;
    }
  }
  if (this[0x1832] == (BitpackingState<unsigned_char,signed_char>)0x1) {
    BVar3 = this[0x182a];
    iVar1 = 0x1f;
    if (BVar3 != (BitpackingState<unsigned_char,signed_char>)0x0) {
      for (; (byte)BVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    bVar8 = 8 - ((byte)iVar1 ^ 7);
    if (BVar3 == (BitpackingState<unsigned_char,signed_char>)0x0) {
      bVar8 = 0;
    }
    values = *(uchar **)(this + 0x808);
    BVar3 = this[0x1828];
    if (*(long *)(this + 0x1810) == 0) {
      uVar9 = 0;
    }
    else {
      uVar6 = 0;
      do {
        values[uVar6] = values[uVar6] - (char)BVar3;
        uVar6 = uVar6 + 1;
        uVar9 = *(ulong *)(this + 0x1810);
      } while (uVar6 < uVar9);
      values = *(uchar **)(this + 0x808);
      BVar3 = this[0x1828];
    }
    BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::WriteFor
              (values,(bool *)(this + 0x1010),bVar8,(uchar)BVar3,uVar9,*(void **)(this + 0x1820));
    uVar9 = *(ulong *)(this + 0x1810);
    if ((uVar9 & 0x1f) != 0) {
      uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar9 & 0x1f);
      uVar9 = (uVar9 - uVar4) + 0x20;
    }
    *(ulong *)(this + 0x1818) = *(long *)(this + 0x1818) + (bVar8 * uVar9 >> 3) + 9;
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}